

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ReadBinaryFile(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
              string *file)

{
  byte bVar1;
  runtime_error *this;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  allocator<unsigned_char> local_299;
  undefined1 local_298 [12];
  undefined1 local_288 [12];
  undefined1 local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  istream_type local_220 [8];
  ifstream in;
  string *file_local;
  
  std::ifstream::ifstream(local_220,(string *)file,_S_bin);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    local_271 = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    s_abi_cxx11_(&local_270,"Failed to open file: ",0x15);
    std::operator+(&local_250,&local_270,file);
    std::runtime_error::runtime_error(this,(string *)&local_250);
    local_271 = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_288,local_220);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_298);
  std::allocator<unsigned_char>::allocator(&local_299);
  __last._12_4_ = 0;
  __last._M_sbuf = (streambuf_type *)local_298._0_8_;
  __last._M_c = local_298._8_4_;
  __first._12_4_ = 0;
  __first._M_sbuf = (streambuf_type *)local_288._0_8_;
  __first._M_c = local_288._8_4_;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first,
             __last,&local_299);
  std::allocator<unsigned_char>::~allocator(&local_299);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> ReadBinaryFile(std::string const& file) {
  std::ifstream in(file, std::ios_base::binary);
  if (!in.good()) {
    throw std::runtime_error("Failed to open file: "s + file);
  }

  return std::vector<uint8_t>(std::istreambuf_iterator<char>(in),
                              std::istreambuf_iterator<char>());
}